

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segments.cpp
# Opt level: O2

void __thiscall r_comp::Reference::Reference(Reference *this,uintptr_t i,Class *c,Class *cc)

{
  this->index = i;
  Class::Class(&this->_class,c);
  Class::Class(&this->cast_class,cc);
  return;
}

Assistant:

Reference::Reference(const uintptr_t i, const Class &c, const Class &cc): index(i), _class(c), cast_class(cc)
{
}